

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

bool __thiscall
QObjectPrivate::isSignalConnected(QObjectPrivate *this,uint signalIndex,bool checkDeclarative)

{
  __pointer_type pCVar1;
  __base_type _Var2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  undefined7 in_register_00000011;
  
  if (((((int)CONCAT71(in_register_00000011,checkDeclarative) != 0) &&
       (((this->super_QObjectData).field_0x30 & 8) == 0)) &&
      (QAbstractDeclarativeData::isSignalConnected !=
       (_func_bool_QAbstractDeclarativeData_ptr_QObject_ptr_int *)0x0 &&
       (this->field_3).currentChildBeingDeleted != (QObject *)0x0)) &&
     (bVar3 = (*QAbstractDeclarativeData::isSignalConnected)
                        ((QAbstractDeclarativeData *)(this->field_3).currentChildBeingDeleted,
                         (this->super_QObjectData).q_ptr,signalIndex), bVar3)) {
    return true;
  }
  pCVar1 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if ((pCVar1 != (__pointer_type)0x0) &&
     (_Var2._M_p = (pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                   _q_value._M_b._M_p, _Var2._M_p != (__pointer_type)0x0)) {
    if (*(long *)&_Var2._M_p[1].super_ConnectionOrSignalVector != 0) {
      return true;
    }
    if ((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
        ._M_p == (__pointer_type)0x0) {
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = (uint)((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                     _q_value._M_b._M_p)->allocated;
    }
    if ((signalIndex < uVar4) &&
       (lVar5 = *(long *)&_Var2._M_p[(long)(int)signalIndex + 2].super_ConnectionOrSignalVector,
       lVar5 != 0)) {
      do {
        bVar3 = *(long *)(lVar5 + 0x28) != 0;
        if (bVar3) {
          return bVar3;
        }
        lVar5 = *(long *)(lVar5 + 0x10);
      } while (lVar5 != 0);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool QObjectPrivate::isSignalConnected(uint signalIndex, bool checkDeclarative) const
{
    if (checkDeclarative && isDeclarativeSignalConnected(signalIndex))
        return true;

    ConnectionData *cd = connections.loadAcquire();
    if (!cd)
        return false;
    SignalVector *signalVector = cd->signalVector.loadRelaxed();
    if (!signalVector)
        return false;

    if (signalVector->at(-1).first.loadRelaxed())
        return true;

    if (signalIndex < uint(cd->signalVectorCount())) {
        const QObjectPrivate::Connection *c = signalVector->at(signalIndex).first.loadRelaxed();
        while (c) {
            if (c->receiver.loadRelaxed())
                return true;
            c = c->nextConnectionList.loadRelaxed();
        }
    }
    return false;
}